

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_70a26::PedestrianPlugIn::redraw
          (PedestrianPlugIn *this,float currentTime,float elapsedTime)

{
  bool bVar1;
  Vec3 *location;
  Color *color_00;
  ostream *poVar2;
  ostream *this_00;
  ostream *poVar3;
  long in_RDI;
  float fVar4;
  float extraout_XMM0_Da;
  Vec3 VVar5;
  Vec3 screenLocation;
  float h;
  ostringstream status;
  ostringstream annote;
  char *spacer;
  float camDistance;
  Vec3 camPosition;
  Vec3 textPosition;
  Vec3 textOffset;
  Color color;
  iterator i;
  AbstractVehicle *nearMouse;
  AbstractVehicle *selected;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  float in_stack_fffffffffffffb10;
  float in_stack_fffffffffffffb14;
  Vec3 *in_stack_fffffffffffffb18;
  ostringstream *this_01;
  Vec3 *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  Vec3 *in_stack_fffffffffffffb30;
  Vec3 *in_stack_fffffffffffffb40;
  PedestrianPlugIn *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  float in_stack_fffffffffffffb6c;
  ostream *in_stack_fffffffffffffb70;
  Vec3 *in_stack_fffffffffffffb88;
  float in_stack_fffffffffffffb90;
  Vec3 local_440;
  float local_434;
  ostringstream local_430 [380];
  int local_2b4;
  fmtflags local_2b0;
  int local_29c;
  ostringstream local_298 [136];
  AbstractVehicle *in_stack_fffffffffffffdf0;
  AbstractVehicle *in_stack_fffffffffffffdf8;
  PedestrianPlugIn *in_stack_fffffffffffffe00;
  Vec3 local_9c;
  Color local_90;
  Pedestrian **local_80;
  Pedestrian **local_78;
  Pedestrian **local_70;
  __normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
  local_68;
  Vec3 local_60;
  undefined8 local_4c;
  float local_44;
  Vec3 local_30;
  AbstractVehicle *local_20;
  AbstractVehicle *local_18;
  
  local_18 = OpenSteer::OpenSteerDemo::selectedVehicle;
  local_20 = OpenSteer::OpenSteerDemo::vehicleNearestToMouse();
  OpenSteer::OpenSteerDemo::updateCamera
            (in_stack_fffffffffffffb14,in_stack_fffffffffffffb10,
             (AbstractVehicle *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  if (OpenSteer::OpenSteerDemo::selectedVehicle != (AbstractVehicle *)0x0) {
    (*(local_18->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])();
    VVar5 = OpenSteer::Vec3::operator=((Vec3 *)(in_RDI + 0x20),&local_30);
    local_60._0_8_ = VVar5._0_8_;
    local_4c._0_4_ = local_60.x;
    local_4c._4_4_ = local_60.y;
    local_60.z = VVar5.z;
    local_44 = local_60.z;
    local_60 = VVar5;
  }
  OpenSteer::OpenSteerDemo::gridUtility(in_stack_fffffffffffffb40);
  local_70 = (Pedestrian **)
             std::
             vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
             ::begin((vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  __gnu_cxx::
  __normal_iterator<(anonymous_namespace)::Pedestrian*const*,std::vector<(anonymous_namespace)::Pedestrian*,std::allocator<(anonymous_namespace)::Pedestrian*>>>
  ::__normal_iterator<(anonymous_namespace)::Pedestrian**>
            ((__normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
              *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             (__normal_iterator<(anonymous_namespace)::Pedestrian_**,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
              *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  while( true ) {
    local_78 = (Pedestrian **)
               std::
               vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
               ::end((vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       (__normal_iterator<(anonymous_namespace)::Pedestrian_**,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
    ::operator*(&local_68);
    Pedestrian::draw((Pedestrian *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    local_80 = (Pedestrian **)
               __gnu_cxx::
               __normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
               ::operator++((__normal_iterator<(anonymous_namespace)::Pedestrian_*const_*,_std::vector<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>_>
                             *)in_stack_fffffffffffffb18,(int)in_stack_fffffffffffffb14);
  }
  drawPathAndObstacles(in_stack_fffffffffffffb60);
  OpenSteer::OpenSteerDemo::highlightVehicleUtility((AbstractVehicle *)in_stack_fffffffffffffb40);
  serialNumberAnnotationUtility
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  if ((OpenSteer::OpenSteerDemo::selectedVehicle != (AbstractVehicle *)0x0) &&
     (bVar1 = OpenSteer::annotationIsOn(), bVar1)) {
    OpenSteer::Color::Color(&local_90,0.8,0.8,1.0,1.0);
    in_stack_fffffffffffffb88 = &local_9c;
    OpenSteer::Vec3::Vec3(in_stack_fffffffffffffb88,0.0,0.25,0.0);
    (*(local_18->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])();
    OpenSteer::Vec3::operator+(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    OpenSteer::LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::position
              (&OpenSteer::OpenSteerDemo::camera.super_LocalSpace);
    (*(local_18->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])();
    fVar4 = OpenSteer::Vec3::distance
                      (in_stack_fffffffffffffb30,
                       (Vec3 *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    std::__cxx11::ostringstream::ostringstream(local_298);
    local_29c = (int)std::setprecision(2);
    std::operator<<((ostream *)local_298,(_Setprecision)local_29c);
    local_2b0 = (fmtflags)std::setiosflags(_S_fixed);
    std::operator<<((ostream *)local_298,(_Setiosflags)local_2b0);
    poVar3 = std::operator<<((ostream *)local_298,"      ");
    in_stack_fffffffffffffb70 = std::operator<<(poVar3,"1: speed: ");
    (*(local_18->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0x1b])();
    in_stack_fffffffffffffb6c = extraout_XMM0_Da;
    in_stack_fffffffffffffb60 =
         (PedestrianPlugIn *)std::ostream::operator<<(in_stack_fffffffffffffb70,extraout_XMM0_Da);
    std::ostream::operator<<(in_stack_fffffffffffffb60,std::endl<char,std::char_traits<char>>);
    local_2b4 = (int)std::setprecision(1);
    std::operator<<((ostream *)local_298,(_Setprecision)local_2b4);
    poVar3 = std::operator<<((ostream *)local_298,"      ");
    location = (Vec3 *)std::operator<<(poVar3,"2: cam dist: ");
    color_00 = (Color *)std::ostream::operator<<(location,fVar4);
    std::ostream::operator<<(color_00,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)local_298,"      ");
    this_00 = std::operator<<(poVar2,"3: no third thing");
    std::ostream::operator<<(this_00,std::ends<char,std::char_traits<char>>);
    OpenSteer::drawGetWindowWidth();
    OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dTextAt3dLocation
              ((ostringstream *)poVar3,location,color_00,(float)((ulong)poVar2 >> 0x20),
               SUB84(poVar2,0));
    std::__cxx11::ostringstream::~ostringstream(local_298);
  }
  this_01 = local_430;
  std::__cxx11::ostringstream::ostringstream(this_01);
  poVar3 = std::operator<<((ostream *)this_01,"[F1/F2] Crowd size: ");
  std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x38));
  std::operator<<((ostream *)local_430,"\n[F3] PD type: ");
  if (*(int *)(in_RDI + 0x3c) == 0) {
    std::operator<<((ostream *)local_430,"LQ bin lattice");
  }
  else if (*(int *)(in_RDI + 0x3c) == 1) {
    std::operator<<((ostream *)local_430,"brute force");
  }
  std::operator<<((ostream *)local_430,"\n[F4] ");
  if (((anonymous_namespace)::gUseDirectedPathFollowing & 1) == 0) {
    std::operator<<((ostream *)local_430,"Stay on the path.");
  }
  else {
    std::operator<<((ostream *)local_430,"Directed path following.");
  }
  std::operator<<((ostream *)local_430,"\n[F5] Wander: ");
  if (((anonymous_namespace)::gWanderSwitch & 1) == 0) {
    std::operator<<((ostream *)local_430,"no");
  }
  else {
    std::operator<<((ostream *)local_430,"yes");
  }
  std::ostream::operator<<(local_430,std::endl<char,std::char_traits<char>>);
  local_434 = OpenSteer::drawGetWindowHeight();
  OpenSteer::Vec3::Vec3(&local_440,10.0,local_434 + -50.0,0.0);
  OpenSteer::drawGetWindowWidth();
  OpenSteer::drawGetWindowHeight();
  VVar5.z = in_stack_fffffffffffffb90;
  VVar5._0_8_ = in_stack_fffffffffffffb88;
  OpenSteer::draw2dTextAt2dLocation
            ((ostringstream *)in_stack_fffffffffffffb70,VVar5,
             (Color *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             (float)((ulong)in_stack_fffffffffffffb60 >> 0x20),SUB84(in_stack_fffffffffffffb60,0));
  std::__cxx11::ostringstream::~ostringstream(local_430);
  return;
}

Assistant:

void redraw (const float currentTime, const float elapsedTime)
    {
        // selected Pedestrian (user can mouse click to select another)
        AbstractVehicle* selected = OpenSteerDemo::selectedVehicle;
        
        // Pedestrian nearest mouse (to be highlighted)
        AbstractVehicle* nearMouse = OpenSteerDemo::vehicleNearestToMouse ();
        
        // update camera
        OpenSteerDemo::updateCamera (currentTime, elapsedTime, selected);
        
        // draw "ground plane"
        if (OpenSteerDemo::selectedVehicle) gridCenter = selected->position();
        OpenSteerDemo::gridUtility (gridCenter);
        
        // draw and annotate each Pedestrian
        for (iterator i = crowd.begin(); i != crowd.end(); i++) (**i).draw (); 
        
        // draw the path they follow and obstacles they avoid
        drawPathAndObstacles ();
        
        // highlight Pedestrian nearest mouse
        OpenSteerDemo::highlightVehicleUtility (nearMouse);
        
        // textual annotation (at the vehicle's screen position)
        serialNumberAnnotationUtility (selected, nearMouse);
        
        // textual annotation for selected Pedestrian
        if (OpenSteerDemo::selectedVehicle && OpenSteer::annotationIsOn())
        {
            const Color color (0.8f, 0.8f, 1.0f);
            const Vec3 textOffset (0, 0.25f, 0);
            const Vec3 textPosition = selected->position() + textOffset;
            const Vec3 camPosition = OpenSteerDemo::camera.position();
            const float camDistance = Vec3::distance (selected->position(),
                                                      camPosition);
            const char* spacer = "      ";
            std::ostringstream annote;
            annote << std::setprecision (2);
            annote << std::setiosflags (std::ios::fixed);
            annote << spacer << "1: speed: " << selected->speed() << std::endl;
            annote << std::setprecision (1);
            annote << spacer << "2: cam dist: " << camDistance << std::endl;
            annote << spacer << "3: no third thing" << std::ends;
            draw2dTextAt3dLocation (annote, textPosition, color, drawGetWindowWidth(), drawGetWindowHeight());
        }
        
        // display status in the upper left corner of the window
        std::ostringstream status;
        status << "[F1/F2] Crowd size: " << population;
        status << "\n[F3] PD type: ";
        switch (cyclePD)
        {
            case 0: status << "LQ bin lattice"; break;
            case 1: status << "brute force";    break;
        }
        status << "\n[F4] ";
        if (gUseDirectedPathFollowing)
            status << "Directed path following.";
        else
            status << "Stay on the path.";
        status << "\n[F5] Wander: ";
        if (gWanderSwitch) status << "yes"; else status << "no";
        status << std::endl;
        const float h = drawGetWindowHeight ();
        const Vec3 screenLocation (10, h-50, 0);
        draw2dTextAt2dLocation (status, screenLocation, gGray80, drawGetWindowWidth(), drawGetWindowHeight());
    }